

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O2

void __thiscall Memory::Recycler::Prime(Recycler *this)

{
  bool bVar1;
  
  bVar1 = Js::ConfigFlagsTable::IsEnabled(this->recyclerFlagsTable,ForceFragmentAddressSpaceFlag);
  if (bVar1) {
    return;
  }
  HeapInfoManager::Prime(&this->autoHeap);
  return;
}

Assistant:

void
Recycler::Prime()
{
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
    if (GetRecyclerFlagsTable().IsEnabled(Js::ForceFragmentAddressSpaceFlag))
    {
        // Never prime the recycler if we are forced to fragment address space
        return;
    }
#endif
   autoHeap.Prime();
}